

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void compare_numbers<long_long,long_long>(char *description,longlong *expected,longlong *actual)

{
  ostream *poVar1;
  void *this;
  longlong *actual_local;
  longlong *expected_local;
  char *description_local;
  
  if (*expected != *actual) {
    poVar1 = std::operator<<((ostream *)&std::cerr,description);
    poVar1 = std::operator<<(poVar1,": expected = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*expected);
    poVar1 = std::operator<<(poVar1,"; actual = ");
    this = (void *)std::ostream::operator<<(poVar1,*actual);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

static void
compare_numbers(char const* description, T1 const& expected, T2 const& actual)
{
    if (expected != actual) {
        std::cerr << description << ": expected = " << expected << "; actual = " << actual
                  << std::endl;
    }
}